

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O3

void mkElimClause(vec<unsigned_int> *elimclauses,Var v,Clause *c)

{
  int iVar1;
  uint uVar2;
  uint *puVar3;
  undefined8 in_RAX;
  long lVar4;
  int iVar5;
  ulong uVar6;
  undefined8 local_38;
  
  iVar1 = elimclauses->sz;
  lVar4 = -1;
  local_38 = in_RAX;
  if ((ulong)c->header >> 0x22 != 0) {
    iVar5 = -1;
    uVar6 = 0;
    do {
      local_38 = CONCAT44(local_38._4_4_,*(undefined4 *)(&c[1].header.field_0x0 + uVar6 * 4));
      Minisat::vec<unsigned_int>::push(elimclauses,(uint *)&local_38);
      if (*(int *)(&c[1].header.field_0x0 + uVar6 * 4) >> 1 == v) {
        iVar5 = iVar1 + (int)uVar6;
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < (ulong)c->header >> 0x22);
    lVar4 = (long)iVar5;
  }
  puVar3 = elimclauses->data;
  uVar2 = puVar3[lVar4];
  puVar3[lVar4] = puVar3[iVar1];
  puVar3[iVar1] = uVar2;
  local_38 = CONCAT44(SUB84(c->header,4) >> 2,(uint)local_38);
  Minisat::vec<unsigned_int>::push(elimclauses,(uint *)((long)&local_38 + 4));
  return;
}

Assistant:

static void mkElimClause(vec<uint32_t> &elimclauses, Var v, Clause &c)
{
    int first = elimclauses.size();
    int v_pos = -1;

    // Copy clause to elimclauses-vector. Remember position where the
    // variable 'v' occurs:
    for (int i = 0; i < c.size(); i++) {
        elimclauses.push(toInt(c[i]));
        if (var(c[i]) == v) v_pos = i + first;
    }
    assert(v_pos != -1);

    // Swap the first literal with the 'v' literal, so that the literal
    // containing 'v' will occur first in the clause:
    uint32_t tmp = elimclauses[v_pos];
    elimclauses[v_pos] = elimclauses[first];
    elimclauses[first] = tmp;

    // Store the length of the clause last:
    elimclauses.push(c.size());
}